

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  cmLocalGenerator *pcVar6;
  cmGeneratorTarget *this_00;
  char *__s;
  byte bVar7;
  _Alloc_hider _Var8;
  string *psVar9;
  string prop;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmListFileBacktrace local_98;
  cmListFileBacktrace lfbt;
  anon_class_16_2_c95d1c49 print_err;
  cmGeneratorExpression ge;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  pcVar2 = (genVars->GenNameUpper->_M_dataplus)._M_p;
  print_err.this = this;
  print_err.genVars = genVars;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&prop,pcVar2,pcVar2 + genVars->GenNameUpper->_M_string_length);
  std::__cxx11::string::append((char *)&prop);
  pcVar5 = cmTarget::GetSafeProperty(this->Target->Target,&prop);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&val,pcVar5,(allocator<char> *)&__str_1);
  psVar9 = output;
  if (val._M_string_length != 0) {
    cmMakefile::GetBacktrace(this->Target->Target->Makefile);
    local_98.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = lfbt.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (lfbt.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (lfbt.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (lfbt.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_98);
    if (local_98.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
    pcVar6 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"");
    local_50._8_8_ = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_allocated_capacity = (size_type)&local_40;
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,pcVar6,
               &__str_1,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(string *)&local_50);
    std::__cxx11::string::_M_assign((string *)&genVars->Executable);
    paVar1 = &__str_1.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_allocated_capacity != &local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    if (lfbt.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (lfbt.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((genVars->Executable)._M_string_length == 0 && !ignoreMissingTarget) {
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_1,prop._M_dataplus._M_p,
                 prop._M_dataplus._M_p + prop._M_string_length);
      std::__cxx11::string::append((char *)&__str_1);
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,&__str_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      psVar9 = (string *)0x0;
    }
    else {
      bVar3 = cmsys::SystemTools::FileExists(&genVars->Executable);
      genVars->ExecutableExists = bVar3;
      psVar9 = (string *)0x1;
    }
  }
  bVar7 = (byte)psVar9;
  paVar1 = &val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)val._M_dataplus._M_p != paVar1) {
    operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prop._M_dataplus._M_p != &prop.field_2) {
    operator_delete(prop._M_dataplus._M_p,
                    CONCAT71(prop.field_2._M_allocated_capacity._1_7_,prop.field_2._M_local_buf[0])
                    + 1);
  }
  if (val._M_string_length != 0) goto LAB_001e597d;
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  prop._M_string_length = 0;
  prop.field_2._M_local_buf[0] = '\0';
  uVar4 = (this->QtVersion).Major - 4;
  if (uVar4 < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&prop,0,(char *)0x0,
               (ulong)(&DAT_004e60e8 + *(int *)(&DAT_004e60e8 + (ulong)uVar4 * 4)));
  }
  std::__cxx11::string::_M_append((char *)&prop,(ulong)(executable->_M_dataplus)._M_p);
  pcVar6 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar6,&prop);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    bVar7 = 1;
    if (!ignoreMissingTarget) {
      val._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"Could not find ","");
      std::__cxx11::string::_M_append((char *)&val,(ulong)(executable->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&val);
      std::__cxx11::string::_M_append((char *)&val,(ulong)prop._M_dataplus._M_p);
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)val._M_dataplus._M_p != paVar1) {
        operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
      }
      bVar7 = 0;
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&genVars->ExecutableTargetName);
    genVars->ExecutableTarget = this_00;
    bVar3 = cmGeneratorTarget::IsImported(this_00);
    if (bVar3) {
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"");
      cmGeneratorTarget::ImportedGetLocation(&val,this_00,&__str_1);
      std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)val._M_dataplus._M_p != &val.field_2) {
        operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
      }
      val.field_2._M_allocated_capacity = __str_1.field_2._M_allocated_capacity;
      _Var8._M_p = __str_1._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
LAB_001e58de:
        operator_delete(_Var8._M_p,val.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      val._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"");
      __s = cmGeneratorTarget::GetLocation(this_00,&val);
      pcVar5 = (char *)(genVars->Executable)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&genVars->Executable,0,pcVar5,(ulong)__s);
      _Var8 = val._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)val._M_dataplus._M_p != &val.field_2) goto LAB_001e58de;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prop._M_dataplus._M_p != &prop.field_2) {
    operator_delete(prop._M_dataplus._M_p,
                    CONCAT71(prop.field_2._M_allocated_capacity._1_7_,prop.field_2._M_local_buf[0])
                    + 1);
  }
  if (this_00 != (cmGeneratorTarget *)0x0) {
    prop._M_dataplus._M_p = (pointer)&prop.field_2;
    prop._M_string_length = 0;
    prop.field_2._M_local_buf[0] = '\0';
    bVar3 = cmQtAutoGenGlobalInitializer::GetExecutableTestOutput
                      (this->GlobalInitializer,executable,&genVars->Executable,&prop,output);
    if (bVar3) {
      genVars->ExecutableExists = true;
    }
    else {
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,&prop);
      bVar7 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prop._M_dataplus._M_p != &prop.field_2) {
      operator_delete(prop._M_dataplus._M_p,
                      CONCAT71(prop.field_2._M_allocated_capacity._1_7_,prop.field_2._M_local_buf[0]
                              ) + 1);
    }
    bVar7 = bVar3 | bVar7;
  }
LAB_001e597d:
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget,
                                             std::string* output) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    std::string msg = genVars.GenNameUpper;
    msg += " for target ";
    msg += this->Target->GetName();
    msg += ": ";
    msg += err;
    cmSystemTools::Error(msg);
  };

  // Custom executable
  {
    std::string const prop = genVars.GenNameUpper + "_EXECUTABLE";
    std::string const val = this->Target->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt =
          this->Target->Target->GetMakefile()->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable =
          cge->Evaluate(this->Target->GetLocalGenerator(), "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Check if the provided executable already exists (it's possible for it
      // not to exist when building Qt itself).
      genVars.ExecutableExists = cmSystemTools::FileExists(genVars.Executable);
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    std::string targetName;
    if (this->QtVersion.Major == 4) {
      targetName = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      targetName = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      targetName = "Qt6::";
    }
    targetName += executable;

    // Find target
    cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
    cmGeneratorTarget* target = localGen->FindGeneratorTargetToUse(targetName);
    if (target != nullptr) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = target;
      if (target->IsImported()) {
        genVars.Executable = target->ImportedGetLocation("");
      } else {
        genVars.Executable = target->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        return true;
      }
      std::string err = "Could not find ";
      err += executable;
      err += " executable target ";
      err += targetName;
      print_err(err);
      return false;
    }
  }

  // Test executable
  {
    std::string err;
    if (!this->GlobalInitializer->GetExecutableTestOutput(
          executable, genVars.Executable, err, output)) {
      print_err(err);
      return false;
    }
    genVars.ExecutableExists = true;
  }

  return true;
}